

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O2

RayTracerConfig * RayTracerConfig::fromFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  invalid_argument *piVar4;
  undefined8 uVar5;
  long local_340;
  ifstream file;
  int aiStack_320 [122];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string token;
  undefined1 auStack_98 [8];
  Sphere sphere;
  undefined1 local_78 [8];
  string token_2;
  string token_1;
  
  std::ifstream::ifstream((istream *)&local_340,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&token_2.field_2 + 8),"Unable to open file: ",path);
    std::invalid_argument::invalid_argument(piVar4,(string *)(token_2.field_2._M_local_buf + 8));
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (__return_storage_ptr__->super_BaseConfig).antiAliasing = 2;
  (__return_storage_ptr__->super_BaseConfig).maxRecursionLevel = 1;
  token.field_2._8_8_ = &(__return_storage_ptr__->super_BaseConfig).maxRecursionLevel;
  (__return_storage_ptr__->super_BaseConfig).ambientCoefficient = 0.1;
  (__return_storage_ptr__->super_BaseConfig).background.r = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.g = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.b = '\0';
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = (undefined1  [8])&token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  do {
    piVar3 = std::operator>>((istream *)&local_340,(string *)local_118);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)local_118);
      std::ifstream::~ifstream(&local_340);
      return __return_storage_ptr__;
    }
    if (*(char *)local_118 == '#') {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_340,(string *)local_118);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_118,"aa");
      uVar5 = __return_storage_ptr__;
      if (!bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_118,"ambient");
        piVar3 = (istream *)&local_340;
        if (bVar2) {
LAB_0010a655:
          std::istream::_M_extract<float>((float *)piVar3);
          goto LAB_0010a65a;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_118,"maxRecursion");
        uVar5 = token.field_2._8_8_;
        if (!bVar2) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_118,"depth");
          uVar5 = &(__return_storage_ptr__->super_BaseConfig).imageX;
          if (!bVar2) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_118,"height");
            uVar5 = &(__return_storage_ptr__->super_BaseConfig).imageY;
            if (!bVar2) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_118,"width");
              uVar5 = &(__return_storage_ptr__->super_BaseConfig).imageZ;
              if (!bVar2) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_118,"observer");
                if (bVar2) {
                  piVar3 = std::istream::_M_extract<float>((float *)&local_340);
                  piVar3 = std::istream::_M_extract<float>((float *)piVar3);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_118,"light");
                  if (!bVar2) {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_118,"sphere");
                    if (bVar2) {
                      sphere.radius = 0.0;
                      auStack_98 = (undefined1  [8])0x0;
                      sphere.center._0_7_ = 0;
                      sphere.center._7_4_ = 0;
                      token_2.field_2._8_8_ = &token_1._M_string_length;
                      token_1._M_dataplus._M_p = (pointer)0x0;
                      token_1._M_string_length = token_1._M_string_length & 0xffffffffffffff00;
                      while( true ) {
                        piVar3 = std::operator>>((istream *)&local_340,
                                                 (string *)(token_2.field_2._M_local_buf + 8));
                        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0)
                        break;
                        if (*(char *)token_2.field_2._8_8_ == '#') {
                          std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&local_340,
                                     (string *)(token_2.field_2._M_local_buf + 8));
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&token_2.field_2 + 8),"endSphere");
                          if (bVar2) break;
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&token_2.field_2 + 8),"center");
                          if (bVar2) {
                            piVar3 = std::istream::_M_extract<float>((float *)&local_340);
                            piVar3 = std::istream::_M_extract<float>((float *)piVar3);
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&token_2.field_2 + 8),"radius");
                            piVar3 = (istream *)&local_340;
                            if (!bVar2) {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&token_2.field_2 + 8),"color");
                              if (bVar2) {
                                anon_unknown.dwarf_2b085::operator>>
                                          ((istream *)&local_340,(RGB *)&sphere.center.z);
                                goto LAB_0010a89b;
                              }
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&token_2.field_2 + 8),"reflection");
                              if (!bVar2) {
                                piVar4 = (invalid_argument *)
                                         __cxa_allocate_exception(0x10,&sphere.radius);
                                std::operator+(&local_138,"Unknown token \'",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&token_2.field_2 + 8));
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_78,&local_138,"\'");
                                std::invalid_argument::invalid_argument(piVar4,(string *)local_78);
                                __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                            std::invalid_argument::~invalid_argument);
                              }
                            }
                          }
                          std::istream::_M_extract<float>((float *)piVar3);
                        }
LAB_0010a89b:
                        if (*(int *)((long)aiStack_320 + *(long *)(local_340 + -0x18)) != 0) {
                          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar4,"Invalid config file format.");
                          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                      }
                      std::__cxx11::string::~string((string *)(token_2.field_2._M_local_buf + 8));
                      std::vector<Sphere,_std::allocator<Sphere>_>::emplace_back<Sphere>
                                (&__return_storage_ptr__->spheres,(Sphere *)auStack_98);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_118,"plane");
                      if (!bVar2) {
                        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_78,"Unknown token \'",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_118);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&token_2.field_2 + 8),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_78,"\'");
                        std::invalid_argument::invalid_argument
                                  (piVar4,(string *)(token_2.field_2._M_local_buf + 8));
                        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                    std::invalid_argument::~invalid_argument);
                      }
                      token_1._M_string_length = 0;
                      token_1.field_2._M_allocated_capacity = 0;
                      token_2.field_2._8_8_ = 0;
                      token_1._M_dataplus._M_p = (pointer)0x0;
                      token_1.field_2._8_4_ = 0;
                      local_78 = (undefined1  [8])&token_2._M_string_length;
                      token_2._M_dataplus._M_p = (pointer)0x0;
                      token_2._M_string_length._0_1_ = 0;
                      while( true ) {
                        piVar3 = std::operator>>((istream *)&local_340,(string *)local_78);
                        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0)
                        break;
                        if (*(char *)local_78 == '#') {
                          std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&local_340,(string *)local_78);
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78,"endPlane");
                          if (bVar2) break;
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78,"point");
                          if (bVar2) {
                            piVar3 = std::istream::_M_extract<float>((float *)&local_340);
                            piVar3 = std::istream::_M_extract<float>((float *)piVar3);
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78,"normalVector");
                            if (bVar2) {
                              piVar3 = std::istream::_M_extract<float>((float *)&local_340);
                              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78,"coef");
                              piVar3 = (istream *)&local_340;
                              if (!bVar2) {
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78,"color");
                                if (bVar2) {
                                  anon_unknown.dwarf_2b085::operator>>
                                            ((istream *)&local_340,
                                             (RGB *)((long)&token_1.field_2 + 4));
                                  goto LAB_0010aa0f;
                                }
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78,"reflection");
                                if (!bVar2) {
                                  piVar4 = (invalid_argument *)
                                           __cxa_allocate_exception
                                                     (0x10,(undefined1 *)
                                                           ((long)&token_1.field_2 + 8));
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auStack_98,"Unknown token \'",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78);
                                  std::operator+(&local_138,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auStack_98,"\'");
                                  std::invalid_argument::invalid_argument
                                            (piVar4,(string *)&local_138);
                                  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                              std::invalid_argument::~invalid_argument);
                                }
                              }
                            }
                          }
                          std::istream::_M_extract<float>((float *)piVar3);
                        }
LAB_0010aa0f:
                        if (*(int *)((long)aiStack_320 + *(long *)(local_340 + -0x18)) != 0) {
                          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar4,"Invalid config file format.");
                          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                      }
                      std::__cxx11::string::~string((string *)local_78);
                      std::vector<Plane,_std::allocator<Plane>_>::emplace_back<Plane>
                                (&__return_storage_ptr__->planes,
                                 (Plane *)((long)&token_2.field_2 + 8));
                    }
                    goto LAB_0010a65a;
                  }
                  piVar3 = std::istream::_M_extract<float>((float *)&local_340);
                  piVar3 = std::istream::_M_extract<float>((float *)piVar3);
                }
                goto LAB_0010a655;
              }
            }
          }
        }
      }
      std::istream::operator>>((istream *)&local_340,(int *)uVar5);
    }
LAB_0010a65a:
    if (*(int *)((long)aiStack_320 + *(long *)(local_340 + -0x18)) != 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"Invalid config file format.");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  } while( true );
}

Assistant:

RayTracerConfig RayTracerConfig::fromFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  while (file >> token)
  {
    if (token[0] == '#') // comment, skip entire line
      std::getline(file, token);
    else if (token == "aa")
      file >> config.antiAliasing;
    else if (token == "ambient")
      file >> config.ambientCoefficient;
    else if (token == "maxRecursion")
      file >> config.maxRecursionLevel;
    else if (token == "depth")
      file >> config.imageX;
    else if (token == "height")
      file >> config.imageY;
    else if (token == "width")
      file >> config.imageZ;
    else if (token == "observer")
      file >> config.observer.x >> config.observer.y >> config.observer.z;
    else if (token == "light")
      file >> config.light.x >> config.light.y >> config.light.z;
    else if (token == "sphere")
      config.spheres.push_back(parseSphere(file));
    else if (token == "plane")
      config.planes.push_back(parsePlane(file));
    else
      throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}